

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O1

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceLine(EdgeTracer *this,PointF dEdge,RegressionLine *line)

{
  BitMatrix *pBVar1;
  ByteMatrix *pBVar2;
  pointer pcVar3;
  bool bVar4;
  Value VVar5;
  Value VVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int unaff_R13D;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  PointT<double> PVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  PointF PVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  PointT<double> p;
  PointT<double> p_00;
  PointT<double> p_01;
  uint local_90;
  uint local_8c;
  undefined1 local_88 [32];
  double local_68;
  double dStack_60;
  
  dVar16 = dEdge.y;
  dVar13 = dEdge.x;
  dVar12 = dVar13 * dVar13 + dVar16 * dVar16;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar13;
  auVar14._8_8_ = dVar12;
  auVar14._0_8_ = dVar12;
  PVar19 = (PointF)divpd((undefined1  [16])dEdge,auVar14);
  line->_directionInward = PVar19;
  local_90 = (uint)(ABS(dVar16) < ABS(dVar13));
  auVar20._0_4_ = (int)(local_90 << 0x1f) >> 0x1f;
  auVar20._4_4_ = (int)(local_90 << 0x1f) >> 0x1f;
  auVar20._8_4_ = (int)(local_90 << 0x1f) >> 0x1f;
  auVar20._12_4_ = (int)(local_90 << 0x1f) >> 0x1f;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar16;
  auVar21 = ~auVar20 & auVar21 << 0x40 | auVar18 & auVar20;
  do {
    PVar19.x = (this->super_BitMatrixCursorF).p.x;
    PVar19.y = (this->super_BitMatrixCursorF).p.y;
    RegressionLine::add(line,PVar19);
    uVar8 = ((long)(line->_points).
                   super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(line->_points).
                   super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x70a3d70a3d70a3d7 +
            0x6666666666666666;
    if ((uVar8 >> 1 | (ulong)((uVar8 & 1) != 0) << 0x3f) < 0x51eb851eb851eb9) {
      PVar19 = RegressionLine::centroid(line);
      bVar4 = updateDirectionFromOrigin(this,PVar19);
      if (!bVar4) {
        return false;
      }
    }
    iVar7 = 1;
    local_8c = 3;
    do {
      uVar8 = 0;
      do {
        uVar11 = (uint)uVar8;
        if (uVar11 == local_8c) break;
        uVar9 = -(int)(uVar8 >> 1);
        if ((uVar8 & 1) != 0) {
          uVar9 = uVar11 + 1 >> 1;
        }
        local_68 = auVar21._0_8_;
        dStack_60 = auVar21._8_8_;
        p.x = (double)(int)uVar9 * local_68 +
              (this->super_BitMatrixCursorF).d.x + (this->super_BitMatrixCursorF).p.x;
        p.y = (double)(int)uVar9 * dStack_60 +
              (this->super_BitMatrixCursorF).d.y + (this->super_BitMatrixCursorF).p.y;
        p_00.x = local_68 + p.x;
        p_00.y = dStack_60 + p.y;
        VVar5 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                          (&this->super_BitMatrixCursorF,p_00);
        if (VVar5.v == 1) {
          iVar10 = 3;
          do {
            unaff_R13D = 2;
            local_88._0_8_ = p.x;
            if (((((double)local_88._0_8_ < 0.0) ||
                 (pBVar1 = (this->super_BitMatrixCursorF).img,
                 (double)pBVar1->_width <= (double)local_88._0_8_)) ||
                (local_88._8_8_ = p.y, (double)local_88._8_8_ < 0.0)) ||
               ((double)pBVar1->_height <= (double)local_88._8_8_)) break;
            VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                              (&this->super_BitMatrixCursorF,p);
            if (VVar6.v == 0) {
              dVar13 = floor((double)local_88._0_8_);
              dVar12 = floor((double)local_88._8_8_);
              PVar15.x = dVar13 + 0.5;
              PVar15.y = dVar12 + 0.5;
              (this->super_BitMatrixCursorF).p = PVar15;
              pBVar2 = this->history;
              if (pBVar2 != (ByteMatrix *)0x0) {
                iVar10 = (int)(this->super_BitMatrixCursorF).p.y *
                         (pBVar2->super_Matrix<signed_char>)._width + (int)PVar15.x;
                pcVar3 = (pBVar2->super_Matrix<signed_char>)._data.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (this->state == (int)pcVar3[iVar10]) break;
                pcVar3[iVar10] = (char)this->state;
              }
              unaff_R13D = 0;
              break;
            }
            local_88._0_8_ = (double)local_88._0_8_ - local_68;
            local_88._8_8_ = (double)local_88._8_8_ - dStack_60;
            p_01.x = (double)local_88._0_8_ - (this->super_BitMatrixCursorF).d.x;
            p_01.y = (double)local_88._8_8_ - (this->super_BitMatrixCursorF).d.y;
            VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                              (&this->super_BitMatrixCursorF,p_01);
            uVar9 = (uint)(VVar6.v == 1);
            auVar17._0_8_ = CONCAT44((int)(uVar9 << 0x1f) >> 0x1f,(int)(uVar9 << 0x1f) >> 0x1f);
            auVar17._8_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
            auVar17._12_4_ = (int)(uVar9 << 0x1f) >> 0x1f;
            auVar22._0_8_ =
                 (ulong)((double)local_88._0_8_ - (this->super_BitMatrixCursorF).d.x) &
                 auVar17._0_8_;
            auVar22._8_8_ =
                 (ulong)((double)local_88._8_8_ - (this->super_BitMatrixCursorF).d.y) &
                 auVar17._8_8_;
            p = (PointT<double>)(auVar22 | ~auVar17 & local_88._0_16_);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        uVar8 = (ulong)(uVar11 + 1);
      } while (VVar5.v != 1);
      if (uVar11 <= (uint)(iVar7 * 2)) goto LAB_00153c40;
      iVar7 = iVar7 + 1;
      local_8c = local_8c + 2;
    } while (iVar7 != 3);
    unaff_R13D = 1;
LAB_00153c40:
    if (unaff_R13D != 0) {
      if ((unaff_R13D == 1) &&
         (0x10 < (ulong)((long)(line->_points).
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(line->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start))) {
        PVar19 = RegressionLine::centroid(line);
        bVar4 = updateDirectionFromOrigin(this,PVar19);
        local_90 = (uint)bVar4;
      }
      else {
        local_90 = 0;
      }
    }
    if (unaff_R13D != 0) {
      return local_90._0_1_;
    }
  } while( true );
}

Assistant:

bool traceLine(PointF dEdge, RegressionLine& line)
	{
		line.setDirectionInward(dEdge);
		do {
			log(p);
			line.add(p);
			if (line.points().size() % 50 == 10 && !updateDirectionFromLineCentroid(line))
				return false;
			auto stepResult = traceStep(dEdge, 1, line.isValid());
			if (stepResult != StepResult::FOUND)
				return stepResult == StepResult::OPEN_END && line.points().size() > 1 && updateDirectionFromLineCentroid(line);
		} while (true);
	}